

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

stb_vorbis *
stb_vorbis_open_pushdata(uchar *data,int data_len,int *data_used,int *error,stb_vorbis_alloc *alloc)

{
  int iVar1;
  undefined4 *in_RCX;
  int *in_RDX;
  int in_EDI;
  stb_vorbis p;
  stb_vorbis *f;
  stb_vorbis_alloc *in_stack_fffffffffffff858;
  stb_vorbis *in_stack_fffffffffffff860;
  stb_vorbis *in_stack_fffffffffffff880;
  int local_710;
  undefined4 local_70c;
  vorb *in_stack_fffffffffffffdd8;
  stb_vorbis *local_8;
  
  vorbis_init(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  iVar1 = start_decoder(in_stack_fffffffffffffdd8);
  if (iVar1 == 0) {
    if (local_710 == 0) {
      *in_RCX = local_70c;
    }
    else {
      *in_RCX = 1;
    }
    vorbis_deinit(in_stack_fffffffffffff880);
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    local_8 = vorbis_alloc(in_stack_fffffffffffff860);
    if (local_8 == (stb_vorbis *)0x0) {
      vorbis_deinit(in_stack_fffffffffffff880);
      local_8 = (stb_vorbis *)0x0;
    }
    else {
      memcpy(local_8,&stack0xfffffffffffff858,0x770);
      *in_RDX = (int)local_8->stream - in_EDI;
      *in_RCX = 0;
    }
  }
  return local_8;
}

Assistant:

stb_vorbis *stb_vorbis_open_pushdata(
         const unsigned char *data, int data_len, // the memory available for decoding
         int *data_used,              // only defined if result is not NULL
         int *error, const stb_vorbis_alloc *alloc)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.stream     = (uint8 *) data;
   p.stream_end = (uint8 *) data + data_len;
   p.push_mode  = TRUE;
   if (!start_decoder(&p)) {
      if (p.eof)
         *error = VORBIS_need_more_data;
      else
         *error = p.error;
      vorbis_deinit(&p);
      return NULL;
   }
   f = vorbis_alloc(&p);
   if (f) {
      *f = p;
      *data_used = (int) (f->stream - data);
      *error = 0;
      return f;
   } else {
      vorbis_deinit(&p);
      return NULL;
   }
}